

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O3

bool iDynTree::vectorToString<iDynTree::Position>(Position *in,string *out_str)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  string bufStr;
  stringstream ss;
  char *local_200;
  char *local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  string *local_1e0;
  char local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = out_str;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = true;
  lVar4 = 0;
  do {
    local_1f8 = (char *)0x0;
    local_1f0 = '\0';
    local_200 = &local_1f0;
    if ((bVar1) && ((ulong)ABS(*(double *)(in + lVar4 * 8)) < 0x7ff0000000000000)) {
      iVar3 = idyntree_private_fpconv_dtoa(*(double *)(in + lVar4 * 8),local_1d8);
      pcVar2 = local_1f8;
      local_1d8[iVar3] = '\0';
      strlen(local_1d8);
      std::__cxx11::string::_M_replace((ulong)&local_200,0,pcVar2,(ulong)local_1d8);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (lVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_200,(long)local_1f8);
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_200);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return bVar1;
}

Assistant:

bool inline vectorToString(const iDynTreeVectorType & in, std::string & out_str)
{
    std::stringstream ss;
    bool ok = true;
    for (unsigned int i = 0; i < in.size(); ++i)
    {
        std::string bufStr;
        ok = ok && doubleToStringWithClassicLocale(in(i), bufStr);
        if (i != 0)
        {
            ss << " ";
        }
        ss << bufStr;
    }

    out_str = ss.str();

    return ok;
}